

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void promise_reaction_data_free(JSRuntime *rt,JSPromiseReactionData *rd)

{
  int iVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  
  iVar2 = rd->resolving_funcs[0].tag;
  if (0xfffffff4 < (uint)iVar2) {
    JVar3 = (JSValueUnion)rd->resolving_funcs[0].u.ptr;
    iVar1 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v.tag = iVar2;
      v.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(rt,v);
    }
  }
  iVar2 = rd->resolving_funcs[1].tag;
  if (0xfffffff4 < (uint)iVar2) {
    JVar3 = (JSValueUnion)rd->resolving_funcs[1].u.ptr;
    iVar1 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v_00.tag = iVar2;
      v_00.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(rt,v_00);
    }
  }
  iVar2 = (rd->handler).tag;
  if (0xfffffff4 < (uint)iVar2) {
    JVar3 = (JSValueUnion)(rd->handler).u.ptr;
    iVar1 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v_01.tag = iVar2;
      v_01.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(rt,v_01);
    }
  }
  (*(rt->mf).js_free)(&rt->malloc_state,rd);
  return;
}

Assistant:

static void promise_reaction_data_free(JSRuntime *rt,
                                       JSPromiseReactionData *rd)
{
    JS_FreeValueRT(rt, rd->resolving_funcs[0]);
    JS_FreeValueRT(rt, rd->resolving_funcs[1]);
    JS_FreeValueRT(rt, rd->handler);
    js_free_rt(rt, rd);
}